

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchmittTrigger.h
# Opt level: O3

void __thiscall
iDynTree::SchmittTrigger::SchmittTrigger
          (SchmittTrigger *this,double stableOFFTime,double stableONTime,double lowValueThreshold,
          double highValueThreshold)

{
  this->m_stableOFFTime = stableOFFTime;
  this->m_stableONTime = stableONTime;
  this->m_highValueThreshold = highValueThreshold;
  this->m_lowValueThreshold = lowValueThreshold;
  this->m_currentState = true;
  this->m_rawValue = 0.0;
  this->m_previousTime = -1.0;
  this->m_timer = 0.0;
  this->m_verbose = 0;
  return;
}

Assistant:

void setStableOFFTime(double stableOFFTime) { m_stableOFFTime = stableOFFTime; }